

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMT_PUBLIC_Unmarshal(TPMT_PUBLIC *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC result;
  BOOL flag_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMT_PUBLIC *target_local;
  
  target_local._4_4_ = TPMI_ALG_PUBLIC_Unmarshal(&target->type,buffer,size);
  if ((((target_local._4_4_ == 0) &&
       (target_local._4_4_ = TPMI_ALG_HASH_Unmarshal(&target->nameAlg,buffer,size,flag),
       target_local._4_4_ == 0)) &&
      (target_local._4_4_ = TPMA_OBJECT_Unmarshal(&target->objectAttributes,buffer,size),
      target_local._4_4_ == 0)) &&
     ((target_local._4_4_ = TPM2B_DIGEST_Unmarshal(&target->authPolicy,buffer,size),
      target_local._4_4_ == 0 &&
      (target_local._4_4_ =
            TPMU_PUBLIC_PARMS_Unmarshal(&target->parameters,buffer,size,(uint)target->type),
      target_local._4_4_ == 0)))) {
    target_local._4_4_ = TPMU_PUBLIC_ID_Unmarshal(&target->unique,buffer,size,(uint)target->type);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMT_PUBLIC_Unmarshal(TPMT_PUBLIC *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPMI_ALG_PUBLIC_Unmarshal((TPMI_ALG_PUBLIC *)&(target->type), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)&(target->nameAlg), buffer, size, flag);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMA_OBJECT_Unmarshal((TPMA_OBJECT *)&(target->objectAttributes), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->authPolicy), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_PUBLIC_PARMS_Unmarshal((TPMU_PUBLIC_PARMS *)&(target->parameters), buffer, size, (UINT32)target->type);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_PUBLIC_ID_Unmarshal((TPMU_PUBLIC_ID *)&(target->unique), buffer, size, (UINT32)target->type);
    return result;
}